

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_lib.cc
# Opt level: O0

void __thiscall bssl::SSL_CONFIG::~SSL_CONFIG(SSL_CONFIG *this)

{
  bool bVar1;
  pointer psVar2;
  SSL_CONFIG *this_local;
  
  bVar1 = std::operator!=(&this->ssl->ctx,(nullptr_t)0x0);
  if (bVar1) {
    psVar2 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::operator->(&this->ssl->ctx);
    (*psVar2->x509_method->ssl_config_free)(this);
  }
  Array<unsigned_char>::~Array(&this->client_ech_config_list);
  std::unique_ptr<stack_st_SRTP_PROTECTION_PROFILE,_bssl::internal::Deleter>::~unique_ptr
            (&this->srtp_profiles);
  Array<unsigned_short>::~Array(&this->verify_sigalgs);
  Array<unsigned_char>::~Array(&this->quic_early_data_context);
  Array<unsigned_char>::~Array(&this->quic_transport_params);
  Vector<bssl::ALPSConfig>::~Vector(&this->alps_configs);
  Array<unsigned_char>::~Array(&this->alpn_client_proto_list);
  std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::~unique_ptr(&this->channel_id_private);
  Array<unsigned_short>::~Array(&this->supported_group_list);
  std::optional<bssl::Array<unsigned_char>_>::~optional(&this->requested_trust_anchors);
  std::unique_ptr<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>::~unique_ptr(&this->CA_names);
  std::unique_ptr<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>::~unique_ptr(&this->client_CA);
  std::unique_ptr<char,_bssl::internal::Deleter>::~unique_ptr(&this->psk_identity_hint);
  std::unique_ptr<bssl::CERT,_bssl::internal::Deleter>::~unique_ptr(&this->cert);
  std::unique_ptr<bssl::SSLCipherPreferenceList,_bssl::internal::Deleter>::~unique_ptr
            (&this->cipher_list);
  return;
}

Assistant:

SSL_CONFIG::~SSL_CONFIG() {
  if (ssl->ctx != nullptr) {
    ssl->ctx->x509_method->ssl_config_free(this);
  }
}